

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall
preciseunitOps_flagClearSetPerUnit_Test::~preciseunitOps_flagClearSetPerUnit_Test
          (preciseunitOps_flagClearSetPerUnit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseunitOps, flagClearSetPerUnit)
{
    precise_unit m1(0.245, precise::yd);
    auto m2 = m1.add_per_unit();
    EXPECT_TRUE(m2.is_per_unit());
    EXPECT_FALSE(m1.is_exactly_the_same(m2));
    auto m3 = m2.clear_per_unit();
    EXPECT_FALSE(m3.is_per_unit());
    EXPECT_TRUE(m1.is_exactly_the_same(m3));
    m2.clear_flags();
    EXPECT_TRUE(m2.is_exactly_the_same(m1));
}